

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoCall(Thread *this,Ptr *func,Ptr *out_trap)

{
  ObjectKind OVar1;
  DefinedFunc *func_00;
  pointer pFVar2;
  pointer pFVar3;
  RunResult RVar4;
  int iVar5;
  Values params;
  Values results;
  allocator_type local_59;
  Values local_58;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_40;
  
  func_00 = (DefinedFunc *)func->obj_;
  OVar1 = (func_00->super_Func).super_Extern.super_Object.kind_;
  if (func_00 == (DefinedFunc *)0x0 || OVar1 != HostFunc) {
    if (OVar1 != DefinedFunc) {
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                    ,0x4e,
                    "Derived *wabt::cast(Base *) [Derived = wabt::interp::DefinedFunc, Base = wabt::interp::Func]"
                   );
    }
    RVar4 = PushCall(this,func_00,out_trap);
    if (RVar4 == Trap) {
      return Ok;
    }
  }
  else {
    local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PopValues(this,&(func_00->super_Func).type_.params,&local_58);
    RVar4 = PushCall(this,(HostFunc *)func_00,out_trap);
    if (RVar4 == Trap) {
      if (local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return Trap;
    }
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
              (&local_40,
               (long)(func_00->super_Func).type_.results.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(func_00->super_Func).type_.results.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,&local_59);
    iVar5 = (*(func_00->super_Func).super_Extern.super_Object._vptr_Object[5])
                      (func_00,this,&local_58,&local_40,out_trap);
    if (iVar5 != 1) {
      pFVar2 = (this->frames_).
               super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl
               .super__Vector_impl_data._M_start;
      pFVar3 = (this->frames_).
               super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl
               .super__Vector_impl_data._M_finish;
      (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_finish = pFVar3 + -1;
      if ((pFVar2 != pFVar3 + -1) && (pFVar3[-2].inst != (Instance *)0x0)) {
        this->inst_ = pFVar3[-2].inst;
        this->mod_ = pFVar3[-2].mod;
      }
      PushValues(this,&(func_00->super_Func).type_.results,&local_40);
    }
    if (local_40.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (iVar5 == 1) {
      return Trap;
    }
  }
  return Ok;
}

Assistant:

RunResult Thread::DoCall(const Func::Ptr& func, Trap::Ptr* out_trap) {
  if (auto* host_func = dyn_cast<HostFunc>(func.get())) {
    auto& func_type = host_func->type();

    Values params;
    PopValues(func_type.params, &params);
    if (PushCall(*host_func, out_trap) == RunResult::Trap) {
      return RunResult::Trap;
    }

    Values results(func_type.results.size());
    if (Failed(host_func->Call(*this, params, results, out_trap))) {
      return RunResult::Trap;
    }

    PopCall();
    PushValues(func_type.results, results);
  } else {
    if (PushCall(*cast<DefinedFunc>(func.get()), out_trap) == RunResult::Trap) {
      return RunResult::Ok;
    }
  }
  return RunResult::Ok;
}